

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool set_voice_name(OpenJTalk *oj,char *name)

{
  char *__src;
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  uint c;
  char temp [260];
  char name_extended [260];
  uint local_24c;
  char local_248 [272];
  char local_138 [272];
  
  if ((name != (char *)0x0 && oj != (OpenJTalk *)0x0) && (*name != '\0')) {
    memset(local_248,0,0x104);
    _Var1 = is_name_only(name);
    if (!_Var1) {
      return false;
    }
    sVar2 = strlen(name);
    __src = G_VOICE_EXT;
    sVar3 = strlen(G_VOICE_EXT);
    if (0xfffffffffffffefa < (sVar3 + sVar2) - 0x104) {
      strcpy(local_138,name);
      strcat(local_138,__src);
      local_24c = 0;
      _Var1 = search_file_recursive(oj->dn_voice_dir_path,local_138,local_248,&local_24c,200);
      if (_Var1) {
        strcpy(oj->fn_voice_path,local_248);
        Open_JTalk_load_voice(oj->open_jtalk,local_248);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool set_voice_name(OpenJTalk *oj, const char *name)
{
	if (!oj)
	{
		return false;
	}

	if (name == NULL || strlen(name) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	if (is_name_only(name))
	{
		if (strlen(name) + strlen(G_VOICE_EXT) + 1 > MAX_PATH)
		{
			return false;
		}

		char name_extended[MAX_PATH];
		strcat(strcpy(name_extended, name), G_VOICE_EXT);
		unsigned int c = 0;
		if (search_file_recursive(oj->dn_voice_dir_path, name_extended, temp, &c, VOICESEARCHMAX))
		{
			goto return_true;
		}
	}

	return false;

return_true:
	strcpy(oj->fn_voice_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_voice(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_voice(oj->open_jtalk, temp);
#endif
	return true;
}